

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinLength
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  Interpreter *this_00;
  pointer ppHVar2;
  RuntimeError *__return_storage_ptr__;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  fields;
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  local_78;
  string local_48;
  
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 != 0x10) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    local_78._M_impl._0_8_ = &local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"length takes 1 parameter.","");
    Stack::makeError(__return_storage_ptr__,&this->stack,loc,(string *)&local_78);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  uVar3 = pVVar1->t - ARRAY;
  if (uVar3 < 4) {
    this_00 = (Interpreter *)(pVVar1->v).h;
    switch(pVVar1->t) {
    case ARRAY:
      ppHVar2 = (pointer)((long)(this_00->heap).entities.
                                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                          *(long *)&(this_00->heap).lastMark >> 3);
      break;
    case FUNCTION:
      ppHVar2 = (pointer)(*(long *)&(this_00->stack).calls - (long)(this_00->stack)._vptr_Stack >> 4
                         );
      break;
    case OBJECT:
      objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    *)&local_78,this_00,(HeapObject *)0x1,
                   (bool)((char)(&switchD_00172b8c::switchdataD_001fa37c)[uVar3] + '|'));
      auVar4._0_8_ = (double)CONCAT44(0x43300000,
                                      (int)local_78._M_impl.super__Rb_tree_header._M_node_count);
      auVar4._8_4_ = (int)(local_78._M_impl.super__Rb_tree_header._M_node_count >> 0x20);
      auVar4._12_4_ = 0x45300000;
      local_48._M_dataplus._M_p =
           (pointer)((auVar4._8_8_ - 1.9342813113834067e+25) + (auVar4._0_8_ - 4503599627370496.0));
      (this->scratch).t = NUMBER;
      (this->scratch).v.d = (double)local_48._M_dataplus._M_p;
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree(&local_78);
      return (AST *)0x0;
    case STRING:
      ppHVar2 = (this_00->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    auVar5._8_4_ = (int)((ulong)ppHVar2 >> 0x20);
    auVar5._0_8_ = ppHVar2;
    auVar5._12_4_ = 0x45300000;
    (this->scratch).t = NUMBER;
    (this->scratch).v.d =
         (auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)ppHVar2) - 4503599627370496.0);
    return (AST *)0x0;
  }
  auVar6 = __cxa_allocate_exception(0x38);
  (anonymous_namespace)::type_str_abi_cxx11_
            (&local_48,
             (_anonymous_namespace_ *)
             (ulong)((args->
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                     )._M_impl.super__Vector_impl_data._M_start)->t,auVar6._8_4_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                 "length operates on strings, objects, and arrays, got ",&local_48);
  Stack::makeError(auVar6._0_8_,&this->stack,loc,(string *)&local_78);
  __cxa_throw(auVar6._0_8_,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinLength(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args.size() != 1) {
            throw makeError(loc, "length takes 1 parameter.");
        }
        HeapEntity *e = args[0].v.h;
        switch (args[0].t) {
            case Value::OBJECT: {
                auto fields = objectFields(static_cast<HeapObject *>(e), true);
                scratch = makeNumber(fields.size());
            } break;

            case Value::ARRAY:
                scratch = makeNumber(static_cast<HeapArray *>(e)->elements.size());
                break;

            case Value::STRING:
                scratch = makeNumber(static_cast<HeapString *>(e)->value.length());
                break;

            case Value::FUNCTION:
                scratch = makeNumber(static_cast<HeapClosure *>(e)->params.size());
                break;

            default:
                throw makeError(loc,
                                "length operates on strings, objects, "
                                "and arrays, got " +
                                    type_str(args[0]));
        }
        return nullptr;
    }